

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

void Jinx::Impl::DebugWriteInternal(LogLevel level,Variant *var)

{
  _Rb_tree_node_base *p_Var1;
  CollectionPtr coll;
  String local_38;
  
  if (var->m_type == Collection) {
    Variant::GetCollection((Variant *)&local_38);
    for (p_Var1 = *(_Rb_tree_node_base **)(local_38._M_dataplus._M_p + 0x18);
        p_Var1 != (_Rb_tree_node_base *)(local_38._M_dataplus._M_p + 8);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      DebugWriteInternal(level,(Variant *)&p_Var1[2]._M_parent);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  }
  else {
    Variant::GetString_abi_cxx11_(&local_38,var);
    if (local_38._M_dataplus._M_p != (char *)0x0) {
      LogWrite(level,local_38._M_dataplus._M_p);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_38);
  }
  return;
}

Assistant:

inline_t void DebugWriteInternal(LogLevel level, const Variant & var)
	{
		if (var.IsCollection())
		{
			auto coll = var.GetCollection();
			for (const auto & v : *coll)
			{
				DebugWriteInternal(level, v.second);
			}
		}
		else
		{
			auto str = var.GetString();
			auto cstr = str.c_str();
			if (cstr)
				LogWrite(level, cstr);
		}
	}